

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertEquals
          (UtestShell *this,bool failed,char *expected,char *actual,char *text,char *file,
          size_t line,TestTerminator *testTerminator)

{
  char *fileName;
  TestResult *pTVar1;
  SimpleString local_e0 [2];
  SimpleString local_c0;
  SimpleString local_b0;
  CheckEqualFailure local_a0;
  char *local_38;
  char *file_local;
  char *text_local;
  char *actual_local;
  char *expected_local;
  UtestShell *pUStack_10;
  bool failed_local;
  UtestShell *this_local;
  
  local_38 = file;
  file_local = text;
  text_local = actual;
  actual_local = expected;
  expected_local._7_1_ = failed;
  pUStack_10 = this;
  pTVar1 = getTestResult(this);
  (*pTVar1->_vptr_TestResult[10])();
  fileName = local_38;
  if ((expected_local._7_1_ & 1) != 0) {
    SimpleString::SimpleString(&local_b0,actual_local);
    SimpleString::SimpleString(&local_c0,text_local);
    SimpleString::SimpleString(local_e0,file_local);
    CheckEqualFailure::CheckEqualFailure(&local_a0,this,fileName,line,&local_b0,&local_c0,local_e0);
    (*this->_vptr_UtestShell[0x27])(this,&local_a0,testTerminator);
    CheckEqualFailure::~CheckEqualFailure(&local_a0);
    SimpleString::~SimpleString(local_e0);
    SimpleString::~SimpleString(&local_c0);
    SimpleString::~SimpleString(&local_b0);
  }
  return;
}

Assistant:

void UtestShell::assertEquals(bool failed, const char* expected, const char* actual, const char* text, const char* file, size_t line, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (failed)
        failWith(CheckEqualFailure(this, file, line, expected, actual, text), testTerminator);
}